

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::load_flattened_struct
          (string *__return_storage_ptr__,CompilerGLSL *this,string *basename,SPIRType *type)

{
  SPIRType *type_00;
  string *this_00;
  ulong uVar1;
  string local_70;
  string local_50;
  
  type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  for (uVar1 = 0;
      uVar1 < (uint)(type->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    type_00 = Compiler::get<spirv_cross::SPIRType>
                        (&this->super_Compiler,
                         (type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar1].
                         id);
    if (type_00->basetype == Struct) {
      to_flattened_struct_member(&local_50,this,basename,type,(uint32_t)uVar1);
      load_flattened_struct(&local_70,this,&local_50,type_00);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_50;
    }
    else {
      to_flattened_struct_member(&local_70,this,basename,type,(uint32_t)uVar1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_00 = &local_70;
    }
    ::std::__cxx11::string::~string((string *)this_00);
  }
  ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::load_flattened_struct(const string &basename, const SPIRType &type)
{
	auto expr = type_to_glsl_constructor(type);
	expr += '(';

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		if (i)
			expr += ", ";

		auto &member_type = get<SPIRType>(type.member_types[i]);
		if (member_type.basetype == SPIRType::Struct)
			expr += load_flattened_struct(to_flattened_struct_member(basename, type, i), member_type);
		else
			expr += to_flattened_struct_member(basename, type, i);
	}
	expr += ')';
	return expr;
}